

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  AABBNodeMB4D *node1;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  NodeRef *pNVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM0 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  vint4 ai;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vint4 ai_1;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 ai_3;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi;
  undefined1 auVar39 [16];
  vint4 bi_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi_3;
  undefined1 auVar42 [16];
  undefined1 in_ZMM9 [64];
  vint4 bi_2;
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  Precalculations pre;
  undefined1 local_35a8 [16];
  vbool<4> valid0;
  InstanceArrayIntersectorKMB<4> local_34e8 [16];
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar5 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar20 = vpcmpeqd_avx(auVar5,(undefined1  [16])valid_i->field_0);
    auVar17 = ZEXT816(0) << 0x40;
    auVar5 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar17,5);
    auVar45 = auVar20 & auVar5;
    if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar45[0xf] < '\0')
    {
      auVar3 = vandps_avx(auVar5,auVar20);
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar45 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar34);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      auVar5 = vcmpps_avx(auVar5,auVar40,1);
      auVar20 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar40,auVar5);
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar34);
      auVar5 = vcmpps_avx(auVar5,auVar40,1);
      auVar5 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar40,auVar5);
      auVar6 = vrcpps_avx(auVar20);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = &DAT_3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_fma(auVar20,auVar6,auVar23);
      auVar43 = vrcpps_avx(auVar5);
      auVar48 = vfnmadd213ps_fma(auVar5,auVar43,auVar23);
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar34);
      auVar5 = vcmpps_avx(auVar5,auVar40,1);
      auVar5 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar40,auVar5);
      auVar20 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar17);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar4.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar20,auVar3);
      auVar20 = vrcpps_avx(auVar5);
      auVar5 = vfnmadd213ps_fma(auVar5,auVar20,auVar23);
      auVar34 = vfmadd132ps_fma(auVar5,auVar20,auVar20);
      auVar49 = ZEXT1664(auVar34);
      auVar5 = *(undefined1 (*) [16])ray;
      auVar17 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar17);
      local_35a8._4_4_ = auVar3._4_4_ ^ auVar45._4_4_;
      local_35a8._0_4_ = auVar3._0_4_ ^ auVar45._0_4_;
      local_35a8._8_4_ = auVar3._8_4_ ^ auVar45._8_4_;
      local_35a8._12_4_ = auVar3._12_4_ ^ auVar45._12_4_;
      auVar6 = vfmadd132ps_fma(auVar25,auVar6,auVar6);
      auVar46 = ZEXT1664(auVar6);
      auVar20 = *(undefined1 (*) [16])(ray + 0x10);
      auVar45 = *(undefined1 (*) [16])(ray + 0x20);
      auVar24 = ZEXT1664(CONCAT412(-auVar45._12_4_,
                                   CONCAT48(-auVar45._8_4_,auVar45._0_8_ ^ 0x8000000080000000)));
      auVar43 = vfmadd132ps_fma(auVar48,auVar43,auVar43);
      auVar47 = ZEXT1664(auVar43);
      auVar25._8_4_ = 0xff800000;
      auVar25._0_8_ = 0xff800000ff800000;
      auVar25._12_4_ = 0xff800000;
      auVar17 = vblendvps_avx(auVar25,auVar17,auVar3);
      auVar44 = ZEXT1664(auVar17);
      pNVar14 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar13 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar4;
      auVar17._0_4_ = auVar43._0_4_ * -auVar45._0_4_;
      auVar17._4_4_ = auVar43._4_4_ * -auVar45._4_4_;
      auVar17._8_4_ = auVar43._8_4_ * -auVar45._8_4_;
      auVar17._12_4_ = auVar43._12_4_ * -auVar45._12_4_;
LAB_0063a494:
      paVar13 = paVar13 + -1;
      sVar12 = pNVar14[-1].ptr;
      pNVar14 = pNVar14 + -1;
      bVar16 = true;
      if (sVar12 != 0xfffffffffffffff8) {
        aVar19 = *paVar13;
        auVar43 = auVar44._0_16_;
        auVar45 = vcmpps_avx((undefined1  [16])aVar19,auVar43,1);
        if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar45[0xf] < '\0') {
          do {
            aVar22 = auVar24._0_16_;
            uVar11 = (uint)sVar12;
            auVar45 = auVar46._0_16_;
            auVar48 = auVar49._0_16_;
            auVar25 = auVar47._0_16_;
            if ((sVar12 & 8) != 0) {
              if (sVar12 == 0xfffffffffffffff8) goto LAB_0063a6ac;
              auVar23 = vcmpps_avx(auVar43,(undefined1  [16])aVar19,6);
              if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar23[0xf] < '\0') {
                uVar10 = (ulong)(uVar11 & 0xf);
                auVar23 = vpcmpeqd_avx(auVar23,auVar23);
                valid0.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar23 ^ local_35a8);
                if (uVar10 == 8) goto LAB_0063a764;
                prim = (Primitive_conflict4 *)(sVar12 & 0xfffffffffffffff0);
                uVar9 = 1;
                goto LAB_0063a710;
              }
              break;
            }
            uVar9 = sVar12 & 0xfffffffffffffff0;
            auVar21 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar10 = 0;
            sVar12 = 8;
            do {
              sVar2 = *(size_t *)(uVar9 + uVar10 * 8);
              if (sVar2 != 8) {
                uVar1 = *(undefined4 *)(uVar9 + 0x100 + uVar10 * 4);
                auVar28._4_4_ = uVar1;
                auVar28._0_4_ = uVar1;
                auVar28._8_4_ = uVar1;
                auVar28._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar9 + 0x40 + uVar10 * 4);
                auVar26._4_4_ = uVar1;
                auVar26._0_4_ = uVar1;
                auVar26._8_4_ = uVar1;
                auVar26._12_4_ = uVar1;
                auVar23 = *(undefined1 (*) [16])(ray + 0x70);
                auVar40 = vfmadd231ps_fma(auVar26,auVar23,auVar28);
                uVar1 = *(undefined4 *)(uVar9 + 0x140 + uVar10 * 4);
                auVar31._4_4_ = uVar1;
                auVar31._0_4_ = uVar1;
                auVar31._8_4_ = uVar1;
                auVar31._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar9 + 0x80 + uVar10 * 4);
                auVar29._4_4_ = uVar1;
                auVar29._0_4_ = uVar1;
                auVar29._8_4_ = uVar1;
                auVar29._12_4_ = uVar1;
                auVar18 = vfmadd231ps_fma(auVar29,auVar23,auVar31);
                uVar1 = *(undefined4 *)(uVar9 + 0x180 + uVar10 * 4);
                auVar35._4_4_ = uVar1;
                auVar35._0_4_ = uVar1;
                auVar35._8_4_ = uVar1;
                auVar35._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar9 + 0xc0 + uVar10 * 4);
                auVar32._4_4_ = uVar1;
                auVar32._0_4_ = uVar1;
                auVar32._8_4_ = uVar1;
                auVar32._12_4_ = uVar1;
                auVar29 = vfmadd231ps_fma(auVar32,auVar23,auVar35);
                uVar1 = *(undefined4 *)(uVar9 + 0x120 + uVar10 * 4);
                auVar36._4_4_ = uVar1;
                auVar36._0_4_ = uVar1;
                auVar36._8_4_ = uVar1;
                auVar36._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar9 + 0x60 + uVar10 * 4);
                auVar39._4_4_ = uVar1;
                auVar39._0_4_ = uVar1;
                auVar39._8_4_ = uVar1;
                auVar39._12_4_ = uVar1;
                auVar31 = vfmadd231ps_fma(auVar39,auVar23,auVar36);
                uVar1 = *(undefined4 *)(uVar9 + 0x160 + uVar10 * 4);
                auVar37._4_4_ = uVar1;
                auVar37._0_4_ = uVar1;
                auVar37._8_4_ = uVar1;
                auVar37._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar9 + 0xa0 + uVar10 * 4);
                auVar41._4_4_ = uVar1;
                auVar41._0_4_ = uVar1;
                auVar41._8_4_ = uVar1;
                auVar41._12_4_ = uVar1;
                auVar32 = vfmadd231ps_fma(auVar41,auVar23,auVar37);
                uVar1 = *(undefined4 *)(uVar9 + 0x1a0 + uVar10 * 4);
                auVar38._4_4_ = uVar1;
                auVar38._0_4_ = uVar1;
                auVar38._8_4_ = uVar1;
                auVar38._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar9 + 0xe0 + uVar10 * 4);
                auVar42._4_4_ = uVar1;
                auVar42._0_4_ = uVar1;
                auVar42._8_4_ = uVar1;
                auVar42._12_4_ = uVar1;
                auVar35 = vfmadd231ps_fma(auVar42,auVar23,auVar38);
                auVar8._4_4_ = auVar6._4_4_ * -auVar5._4_4_;
                auVar8._0_4_ = auVar6._0_4_ * -auVar5._0_4_;
                auVar8._8_4_ = auVar6._8_4_ * -auVar5._8_4_;
                auVar8._12_4_ = auVar6._12_4_ * -auVar5._12_4_;
                auVar26 = vfmadd213ps_fma(auVar40,auVar45,auVar8);
                auVar7._4_4_ = auVar34._4_4_ * -auVar20._4_4_;
                auVar7._0_4_ = auVar34._0_4_ * -auVar20._0_4_;
                auVar7._8_4_ = auVar34._8_4_ * -auVar20._8_4_;
                auVar7._12_4_ = auVar34._12_4_ * -auVar20._12_4_;
                auVar28 = vfmadd213ps_fma(auVar18,auVar48,auVar7);
                auVar29 = vfmadd213ps_fma(auVar29,auVar25,auVar17);
                auVar31 = vfmadd213ps_fma(auVar31,auVar45,auVar8);
                auVar32 = vfmadd213ps_fma(auVar32,auVar48,auVar7);
                auVar35 = vfmadd213ps_fma(auVar35,auVar25,auVar17);
                auVar40 = vpminsd_avx(auVar26,auVar31);
                auVar18 = vpminsd_avx(auVar28,auVar32);
                auVar40 = vpmaxsd_avx(auVar40,auVar18);
                auVar18 = vpminsd_avx(auVar29,auVar35);
                auVar40 = vpmaxsd_avx(auVar40,auVar18);
                auVar18 = vpmaxsd_avx(auVar26,auVar31);
                auVar26 = vpmaxsd_avx(auVar28,auVar32);
                auVar26 = vpminsd_avx(auVar18,auVar26);
                auVar18 = vpmaxsd_avx(auVar29,auVar35);
                auVar18 = vpminsd_avx(auVar18,auVar43);
                auVar26 = vpminsd_avx(auVar26,auVar18);
                auVar18 = vpmaxsd_avx(auVar40,(undefined1  [16])aVar4);
                if ((uVar11 & 7) == 6) {
                  auVar18 = vcmpps_avx(auVar18,auVar26,2);
                  uVar1 = *(undefined4 *)(uVar9 + 0x1c0 + uVar10 * 4);
                  auVar30._4_4_ = uVar1;
                  auVar30._0_4_ = uVar1;
                  auVar30._8_4_ = uVar1;
                  auVar30._12_4_ = uVar1;
                  auVar26 = vcmpps_avx(auVar30,auVar23,2);
                  uVar1 = *(undefined4 *)(uVar9 + 0x1e0 + uVar10 * 4);
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar23 = vcmpps_avx(auVar23,auVar33,1);
                  auVar23 = vandps_avx(auVar26,auVar23);
                  auVar23 = vandps_avx(auVar23,auVar18);
                }
                else {
                  auVar23 = vcmpps_avx(auVar18,auVar26,2);
                }
                auVar18 = vcmpps_avx(auVar43,(undefined1  [16])aVar19,6);
                auVar23 = vandps_avx(auVar23,auVar18);
                auVar23 = vpslld_avx(auVar23,0x1f);
                auVar24 = ZEXT1664(auVar23);
                if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar23[0xf] < '\0') {
                  auVar27._8_4_ = 0x7f800000;
                  auVar27._0_8_ = 0x7f8000007f800000;
                  auVar27._12_4_ = 0x7f800000;
                  auVar23 = vblendvps_avx(auVar27,auVar40,auVar23);
                  auVar24 = ZEXT1664(auVar23);
                  if (sVar12 != 8) {
                    pNVar14->ptr = sVar12;
                    pNVar14 = pNVar14 + 1;
                    *paVar13 = auVar21._0_16_;
                    paVar13 = paVar13 + 1;
                  }
                  auVar21 = ZEXT1664(auVar23);
                  sVar12 = sVar2;
                }
              }
            } while ((sVar2 != 8) && (bVar15 = uVar10 < 7, uVar10 = uVar10 + 1, bVar15));
            aVar19 = auVar21._0_16_;
          } while (sVar12 != 8);
        }
        bVar16 = false;
      }
      goto LAB_0063a6ac;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar16 = uVar10 - 8 <= uVar9;
    uVar9 = uVar9 + 1;
    if (bVar16) break;
LAB_0063a710:
    InstanceArrayIntersectorKMB<4>::occluded(local_34e8,&valid0,&pre,ray,context,prim);
    aVar22.v = (__m128)vandnps_avx((undefined1  [16])local_34e8,valid0.field_0);
    auVar23 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_34e8;
    valid0.field_0 = aVar22;
    if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar23[0xf])
    break;
  }
LAB_0063a764:
  auVar23 = vpcmpeqd_avx((undefined1  [16])aVar22,(undefined1  [16])aVar22);
  auVar24 = ZEXT1664(auVar23);
  local_35a8 = vpor_avx(local_35a8,auVar23 ^ (undefined1  [16])valid0.field_0);
  auVar23 = auVar23 & ~local_35a8;
  if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar23[0xf]) {
    auVar46 = ZEXT1664(auVar45);
    auVar47 = ZEXT1664(auVar25);
    auVar49 = ZEXT1664(auVar48);
    auVar44 = ZEXT1664(auVar43);
    bVar16 = true;
  }
  else {
    auVar18._8_4_ = 0xff800000;
    auVar18._0_8_ = 0xff800000ff800000;
    auVar18._12_4_ = 0xff800000;
    auVar43 = vblendvps_avx(auVar43,auVar18,local_35a8);
    auVar44 = ZEXT1664(auVar43);
    bVar16 = false;
    auVar46 = ZEXT1664(auVar45);
    auVar47 = ZEXT1664(auVar25);
    auVar49 = ZEXT1664(auVar48);
  }
LAB_0063a6ac:
  if (bVar16) {
    auVar5 = vandps_avx(auVar3,local_35a8);
    auVar20._8_4_ = 0xff800000;
    auVar20._0_8_ = 0xff800000ff800000;
    auVar20._12_4_ = 0xff800000;
    auVar5 = vmaskmovps_avx(auVar5,auVar20);
    *(undefined1 (*) [16])(ray + 0x80) = auVar5;
    return;
  }
  goto LAB_0063a494;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }